

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  
  inimenu();
  iniVIP();
  welcome();
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------------------------"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    int num = 0, isok = 0;
    inimenu();
    iniVIP();
    welcome();
    frame
    return 0;
}